

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManCollectOverlapCands(Nwk_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  undefined1 *puVar1;
  Nwk_Obj_t *pNVar2;
  Nwk_Obj_t *pCand;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  for (lVar4 = 0; (lVar4 < pLut->nFanins && (pLut->pFanio[lVar4] != (Nwk_Obj_t *)0x0));
      lVar4 = lVar4 + 1) {
    puVar1 = &pLut->pFanio[lVar4]->field_0x20;
    *puVar1 = *puVar1 | 0x40;
  }
  vCands->nSize = 0;
  Nwk_ManIncrementTravId(pLut->pMan);
  pLut->TravId = pLut->pMan->nTravIds;
  for (lVar4 = 0;
      (uVar5 = (ulong)pLut->nFanins, lVar4 < (long)uVar5 &&
      (pNVar2 = pLut->pFanio[lVar4], pNVar2 != (Nwk_Obj_t *)0x0)); lVar4 = lVar4 + 1) {
    if ((*(uint *)&pNVar2->field_0x20 & 7) == 3) {
      iVar6 = pNVar2->nFanouts;
      if (iVar6 <= pPars->nMaxFanout) {
        for (lVar7 = 0;
            ((int)lVar7 < iVar6 &&
            (pCand = pNVar2->pFanio[pNVar2->nFanins + lVar7], pCand != (Nwk_Obj_t *)0x0));
            lVar7 = lVar7 + 1) {
          if (((*(uint *)&pCand->field_0x20 & 7) == 3) &&
             ((iVar3 = pCand->pMan->nTravIds, pCand->TravId != iVar3 &&
              (pCand->TravId = iVar3,
              pCand->Level - pLut->Level <= pPars->nMaxLevelDiff &&
              pLut->Level - pCand->Level <= pPars->nMaxLevelDiff)))) {
            iVar3 = Nwk_ManCountTotalFanins(pLut,pCand);
            if (iVar3 <= pPars->nMaxSuppSize) {
              Vec_PtrPush(vCands,pCand);
              iVar6 = pNVar2->nFanouts;
            }
          }
        }
      }
    }
  }
  for (lVar4 = 0; (lVar4 < (int)uVar5 && (pLut->pFanio[lVar4] != (Nwk_Obj_t *)0x0));
      lVar4 = lVar4 + 1) {
    puVar1 = &pLut->pFanio[lVar4]->field_0x20;
    *puVar1 = *puVar1 & 0xbf;
    uVar5 = (ulong)(uint)pLut->nFanins;
  }
  return;
}

Assistant:

void Nwk_ManCollectOverlapCands( Nwk_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Nwk_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Nwk_ManIncrementTravId( pLut->pMan );
    Nwk_ObjSetTravIdCurrent( pLut );
    Nwk_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Nwk_ObjIsNode(pFanin) )
            continue;
        if ( Nwk_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Nwk_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Nwk_ObjIsNode(pObj) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pObj ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Nwk_ObjLevel(pLut) - Nwk_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Nwk_ObjLevel(pObj) - Nwk_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Nwk_ManCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 0;
}